

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageCommand.cxx
# Opt level: O0

void __thiscall cmCTestCoverageCommand::cmCTestCoverageCommand(cmCTestCoverageCommand *this)

{
  cmCTestCoverageCommand *this_local;
  
  cmCTestHandlerCommand::cmCTestHandlerCommand(&this->super_cmCTestHandlerCommand);
  (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand._vptr_cmCommand =
       (_func_int **)&PTR__cmCTestCoverageCommand_00a86858;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->Labels);
  this->LabelsMentioned = false;
  return;
}

Assistant:

cmCTestCoverageCommand::cmCTestCoverageCommand()
{
  this->LabelsMentioned = false;
}